

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::BeginViewportSideBar
               (char *name,ImGuiViewport *viewport_p,ImGuiDir dir,float axis_size,
               ImGuiWindowFlags window_flags)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ulong uVar3;
  bool bVar4;
  ImGuiWindow *pIVar5;
  ImVec2 IVar6;
  float fVar7;
  float fVar8;
  ImVec2 pos;
  ImVec2 size;
  ImVec2 local_60;
  char *local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  undefined8 local_40;
  ImVec2 local_38;
  
  if (dir == -1) {
    __assert_fail("dir != ImGuiDir_None",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_widgets.cpp"
                  ,0x1a63,
                  "bool ImGui::BeginViewportSideBar(const char *, ImGuiViewport *, ImGuiDir, float, ImGuiWindowFlags)"
                 );
  }
  pIVar5 = FindWindowByName(name);
  if (viewport_p == (ImGuiViewport *)0x0) {
    viewport_p = GetMainViewport();
  }
  if ((pIVar5 == (ImGuiWindow *)0x0) || (pIVar5->BeginCount == 0)) {
    uVar1 = viewport_p[3].ID;
    uVar2 = viewport_p[3].Flags;
    IVar6.x = (viewport_p->Pos).x + (float)uVar1;
    IVar6.y = (viewport_p->Pos).y + (float)uVar2;
    fVar7 = ((viewport_p->Size).x - (float)uVar1) + viewport_p[3].Pos.x;
    fVar8 = ((viewport_p->Size).y - (float)uVar2) + viewport_p[3].Pos.y;
    fVar7 = (float)(-(uint)(0.0 < fVar7) & (uint)fVar7) + IVar6.x;
    fVar8 = (float)(-(uint)(0.0 < fVar8) & (uint)fVar8) + IVar6.y;
    local_40 = CONCAT44(fVar8,fVar7);
    local_60 = IVar6;
    if ((dir | 2U) == 3) {
      uVar3 = (ulong)((dir & 0xfffffffeU) == 2);
      (&local_60.x)[uVar3] = *(float *)((long)&local_40 + uVar3 * 4) - axis_size;
    }
    bVar4 = (dir & 0xfffffffeU) == 2;
    local_50.x = fVar7 - IVar6.x;
    local_50.y = fVar8 - IVar6.y;
    (&local_50.x)[bVar4] = axis_size;
    local_38.x = 0.0;
    local_38.y = 0.0;
    local_58 = name;
    SetNextWindowPos(&local_60,0,&local_38);
    SetNextWindowSize(&local_50,0);
    name = local_58;
    if ((dir & 0xfffffffdU) == 0) {
      (&viewport_p[3].ID)[bVar4] = (ImGuiID)(axis_size + (float)(&viewport_p[3].ID)[bVar4]);
    }
    else if ((dir | 2U) == 3) {
      (&viewport_p[3].Pos.x)[bVar4] = (&viewport_p[3].Pos.x)[bVar4] - axis_size;
    }
  }
  SetNextWindowViewport(viewport_p->ID);
  PushStyleVar(3,0.0);
  local_48.x = 0.0;
  local_48.y = 0.0;
  PushStyleVar(5,&local_48);
  bVar4 = Begin(name,(bool *)0x0,window_flags | 0x200007);
  PopStyleVar(2);
  return bVar4;
}

Assistant:

bool ImGui::BeginViewportSideBar(const char* name, ImGuiViewport* viewport_p, ImGuiDir dir, float axis_size, ImGuiWindowFlags window_flags)
{
    IM_ASSERT(dir != ImGuiDir_None);

    ImGuiWindow* bar_window = FindWindowByName(name);
    ImGuiViewportP* viewport = (ImGuiViewportP*)(void*)(viewport_p ? viewport_p : GetMainViewport());
    if (bar_window == NULL || bar_window->BeginCount == 0)
    {
        // Calculate and set window size/position
        ImRect avail_rect = viewport->GetBuildWorkRect();
        ImGuiAxis axis = (dir == ImGuiDir_Up || dir == ImGuiDir_Down) ? ImGuiAxis_Y : ImGuiAxis_X;
        ImVec2 pos = avail_rect.Min;
        if (dir == ImGuiDir_Right || dir == ImGuiDir_Down)
            pos[axis] = avail_rect.Max[axis] - axis_size;
        ImVec2 size = avail_rect.GetSize();
        size[axis] = axis_size;
        SetNextWindowPos(pos);
        SetNextWindowSize(size);

        // Report our size into work area (for next frame) using actual window size
        if (dir == ImGuiDir_Up || dir == ImGuiDir_Left)
            viewport->BuildWorkOffsetMin[axis] += axis_size;
        else if (dir == ImGuiDir_Down || dir == ImGuiDir_Right)
            viewport->BuildWorkOffsetMax[axis] -= axis_size;
    }

    window_flags |= ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoDocking;
    SetNextWindowViewport(viewport->ID); // Enforce viewport so we don't create our own viewport when ImGuiConfigFlags_ViewportsNoMerge is set.
    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowMinSize, ImVec2(0, 0)); // Lift normal size constraint
    bool is_open = Begin(name, NULL, window_flags);
    PopStyleVar(2);

    return is_open;
}